

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int do_file_type(char *type)

{
  int iVar1;
  char *type_local;
  
  if ((type == (char *)0x0) || (*type == '\0')) {
    type_local._4_4_ = 1;
  }
  else {
    iVar1 = Curl_raw_equal(type,"PEM");
    if (iVar1 == 0) {
      iVar1 = Curl_raw_equal(type,"DER");
      if (iVar1 == 0) {
        iVar1 = Curl_raw_equal(type,"ENG");
        if (iVar1 == 0) {
          iVar1 = Curl_raw_equal(type,"P12");
          if (iVar1 == 0) {
            type_local._4_4_ = -1;
          }
          else {
            type_local._4_4_ = 0x2b;
          }
        }
        else {
          type_local._4_4_ = 0x2a;
        }
      }
      else {
        type_local._4_4_ = 2;
      }
    }
    else {
      type_local._4_4_ = 1;
    }
  }
  return type_local._4_4_;
}

Assistant:

static int do_file_type(const char *type)
{
  if(!type || !type[0])
    return SSL_FILETYPE_PEM;
  if(Curl_raw_equal(type, "PEM"))
    return SSL_FILETYPE_PEM;
  if(Curl_raw_equal(type, "DER"))
    return SSL_FILETYPE_ASN1;
  if(Curl_raw_equal(type, "ENG"))
    return SSL_FILETYPE_ENGINE;
  if(Curl_raw_equal(type, "P12"))
    return SSL_FILETYPE_PKCS12;
  return -1;
}